

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::compute_enable_condition_abi_cxx11_
          (unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top)

{
  __node_base_ptr *__ht;
  undefined1 local_b0 [8];
  EnableStmtVisitor visitor;
  __alloc_node_gen_t __alloc_node_gen;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_b0 = (undefined1  [8])&PTR_visit_root_002bc058;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.values._M_h._M_rehash_policy._M_next_resize;
  visitor.values._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.values._M_h._M_bucket_count = 0;
  visitor.values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.values._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.values._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.values._M_h._M_rehash_policy._4_4_ = 0;
  visitor.values._M_h._M_rehash_policy._M_next_resize = 0;
  IRVisitor::visit_root((IRVisitor *)local_b0,(IRNode *)this);
  __ht = &visitor.super_IRVisitor.visited_._M_h._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_bucket_count = (size_type)visitor.values._M_h._M_buckets;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count =
       (size_type)visitor.values._M_h._M_before_begin._M_nxt;
  *(ulong *)&(__return_storage_ptr__->_M_h)._M_rehash_policy =
       CONCAT44(visitor.values._M_h._M_element_count._4_4_,
                (undefined4)visitor.values._M_h._M_element_count);
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize =
       visitor.values._M_h._M_rehash_policy._0_8_;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  visitor.values._M_h._M_single_bucket = (__node_base_ptr)__return_storage_ptr__;
  std::
  _Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::__cxx11::string>,std::allocator<std::pair<kratos::Stmt_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::__cxx11::string>,std::allocator<std::pair<kratos::Stmt_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Stmt_const*const,std::__cxx11::string>,false>>>>
            ((_Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::__cxx11::string>,std::allocator<std::pair<kratos::Stmt_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)__return_storage_ptr__,
             (_Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)__ht,(_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>_>_>
                      *)&visitor.values._M_h._M_single_bucket);
  local_b0 = (undefined1  [8])&PTR_visit_root_002bc058;
  std::
  _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)__ht);
  local_b0 = (undefined1  [8])&PTR_visit_root_002b6338;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<const Stmt*, std::string> compute_enable_condition(Generator* top) {
    // notice that this pass assumes SSA pass has transformed the always_comb block into
    // top-level continuous assignment
    EnableStmtVisitor visitor;
    visitor.visit_root(top);
    return visitor.values;
}